

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::convertAssignment
          (ASTContext *context,Type *type,Expression *expr,SourceRange assignmentRange,
          Expression **lhsExpr,bitmask<slang::ast::AssignFlags> *assignFlags)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange operatorRange;
  SourceRange assignmentRange_00;
  SourceRange operatorRange_00;
  SourceRange operatorRange_01;
  bool bVar1;
  bool bVar2;
  ConversionKind CVar3;
  Compilation *args_2;
  InstanceSymbolBase *pIVar4;
  Expression *pEVar5;
  ValueRangeExpression *this;
  Type *pTVar6;
  SourceLocation in_RCX;
  ConversionExpression *in_RDX;
  Expression **in_RSI;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  undefined8 *in_R9;
  bitmask<slang::ast::AssignFlags> *in_stack_00000008;
  Diagnostic *diag;
  DiagCode code;
  ValueRangeExpression *vre;
  anon_class_40_5_378a8a91 convert;
  Expression *conn_1;
  Expression *conn;
  InstanceSymbolBase *instance;
  anon_class_24_3_290f256b finalizeType;
  Type *rt;
  Expression *result;
  Compilation *comp;
  InstanceSymbolBase *in_stack_00000210;
  Expression *in_stack_00000218;
  Type *in_stack_00000220;
  ASTContext *in_stack_00000228;
  Expression *in_stack_fffffffffffffe38;
  Compilation *in_stack_fffffffffffffe40;
  Type *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  ASTContext *in_stack_fffffffffffffe58;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  SourceLocation in_stack_fffffffffffffe68;
  Compilation *in_stack_fffffffffffffe70;
  DiagCode DVar7;
  Compilation *in_stack_fffffffffffffe78;
  Type *args;
  Expression *in_stack_fffffffffffffe80;
  Type *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  ConversionKind in_stack_fffffffffffffe94;
  Type *in_stack_fffffffffffffe98;
  StreamingConcatenationExpression *in_stack_fffffffffffffea0;
  Type *in_stack_fffffffffffffea8;
  SourceLocation in_stack_fffffffffffffeb0;
  SourceLocation in_stack_fffffffffffffeb8;
  bitmask<slang::ast::ASTFlags> local_118;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Type *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff38;
  Expression *in_stack_ffffffffffffff40;
  Expression *in_stack_ffffffffffffff48;
  Type *in_stack_ffffffffffffff50;
  Type *in_stack_ffffffffffffff58;
  ASTContext *in_stack_ffffffffffffff60;
  ConversionExpression *local_8;
  
  CVar3 = (ConversionKind)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  bVar1 = bad((Expression *)in_stack_fffffffffffffe40);
  local_8 = in_RDX;
  if (!bVar1) {
    args_2 = ASTContext::getCompilation((ASTContext *)0x9e9e94);
    bVar1 = Type::isError((Type *)0x9e9ea9);
    if (bVar1) {
      local_8 = (ConversionExpression *)badExpr(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
      ;
    }
    else {
      not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x9e9ef2);
      bVar1 = Type::isEquivalent(in_stack_fffffffffffffe98,
                                 (Type *)CONCAT44(in_stack_fffffffffffffe94,
                                                  in_stack_fffffffffffffe90));
      if (bVar1) {
        convertAssignment::anon_class_24_3_290f256b::operator()
                  ((anon_class_24_3_290f256b *)
                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe48);
        DVar7 = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
        bVar1 = Type::isVoid((Type *)0x9e9f6a);
        if (bVar1) {
          sourceRange.startLoc._6_1_ = in_stack_fffffffffffffe66;
          sourceRange.startLoc._0_6_ = in_stack_fffffffffffffe60;
          sourceRange.startLoc._7_1_ = in_stack_fffffffffffffe67;
          sourceRange.endLoc = in_stack_fffffffffffffe68;
          ASTContext::addDiag(in_stack_fffffffffffffe58,DVar7,sourceRange);
        }
        bVar1 = ASTContext::inUnevaluatedBranch((ASTContext *)in_stack_fffffffffffffe40);
        if ((!bVar1) &&
           (bVar1 = Type::isMatching(in_stack_fffffffffffffef8,
                                     (Type *)CONCAT44(in_stack_fffffffffffffef4,
                                                      in_stack_fffffffffffffef0)), !bVar1)) {
          operatorRange_01.endLoc = in_R8;
          operatorRange_01.startLoc = in_RCX;
          ConversionExpression::checkImplicitConversions
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,operatorRange_01,CVar3);
        }
      }
      else {
        pIVar4 = ASTContext::getInstance(in_RDI);
        if ((pIVar4 != (InstanceSymbolBase *)0x0) &&
           (bVar1 = std::span<const_unsigned_int,_18446744073709551615UL>::empty
                              ((span<const_unsigned_int,_18446744073709551615UL> *)0x9ea09a), !bVar1
           )) {
          in_stack_fffffffffffffe94 = Type::getBitWidth(in_stack_fffffffffffffe48);
          CVar3 = Type::getBitWidth(in_stack_fffffffffffffe48);
          if ((in_stack_fffffffffffffe94 != CVar3) ||
             (bVar1 = Type::isAssignmentCompatible
                                (in_stack_fffffffffffffe98,
                                 (Type *)CONCAT44(in_stack_fffffffffffffe94,
                                                  in_stack_fffffffffffffe90)), !bVar1)) {
            if (in_R9 == (undefined8 *)0x0) {
              pEVar5 = tryConnectPortArray(in_stack_00000228,in_stack_00000220,in_stack_00000218,
                                           in_stack_00000210);
              if (pEVar5 != (Expression *)0x0) {
                selfDetermined((ASTContext *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (Expression **)in_stack_fffffffffffffe88);
                return pEVar5;
              }
            }
            else {
              pEVar5 = tryConnectPortArray(in_stack_00000228,in_stack_00000220,in_stack_00000218,
                                           in_stack_00000210);
              if (pEVar5 != (Expression *)0x0) {
                selfDetermined((ASTContext *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (Expression **)in_stack_fffffffffffffe88);
                *in_R9 = pEVar5;
                if (in_stack_00000008 != (bitmask<slang::ast::AssignFlags> *)0x0) {
                  bitmask<slang::ast::AssignFlags>::bitmask
                            ((bitmask<slang::ast::AssignFlags> *)&stack0xffffffffffffff5f,SlicedPort
                            );
                  bitmask<slang::ast::AssignFlags>::operator|=
                            (in_stack_00000008,
                             (bitmask<slang::ast::AssignFlags> *)&stack0xffffffffffffff5f);
                }
                selfDetermined((ASTContext *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (Expression **)in_stack_fffffffffffffe88);
                return &in_RDX->super_Expression;
              }
            }
          }
        }
        bVar1 = Type::isAssignmentCompatible
                          (in_stack_fffffffffffffe98,
                           (Type *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        if (bVar1) {
          bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffe40);
          if ((bVar1) && (bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffe40), bVar1)) {
            OpInfo::binaryType(in_stack_fffffffffffffe78,(Type *)in_stack_fffffffffffffe70,
                               (Type *)in_stack_fffffffffffffe68,(bool)in_stack_fffffffffffffe67,
                               (bool)in_stack_fffffffffffffe66);
            bVar1 = Type::isEquivalent(in_stack_fffffffffffffe98,
                                       (Type *)CONCAT44(in_stack_fffffffffffffe94,
                                                        in_stack_fffffffffffffe90));
            if (bVar1) {
              convertAssignment::anon_class_24_3_290f256b::operator()
                        ((anon_class_24_3_290f256b *)
                         CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
              return &in_RDX->super_Expression;
            }
            convertAssignment::anon_class_24_3_290f256b::operator()
                      ((anon_class_24_3_290f256b *)
                       CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe48);
          }
          operatorRange_00.endLoc = in_stack_fffffffffffffeb8;
          operatorRange_00.startLoc = in_stack_fffffffffffffeb0;
          local_8 = (ConversionExpression *)
                    ConversionExpression::makeImplicit
                              ((ASTContext *)in_R8,(Type *)in_RCX,in_stack_fffffffffffffe94,
                               (Expression *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                               operatorRange_00);
        }
        else {
          bVar1 = isImplicitlyAssignableTo
                            ((Expression *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                             (Type *)in_stack_fffffffffffffe68);
          if (bVar1) {
            operatorRange.endLoc = in_stack_fffffffffffffeb8;
            operatorRange.startLoc = in_stack_fffffffffffffeb0;
            local_8 = (ConversionExpression *)
                      ConversionExpression::makeImplicit
                                ((ASTContext *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                 in_stack_fffffffffffffe94,(Expression *)in_stack_fffffffffffffe88,
                                 in_stack_fffffffffffffe80,operatorRange);
          }
          else if ((in_RDX->super_Expression).kind == Streaming) {
            as<slang::ast::StreamingConcatenationExpression>(&in_RDX->super_Expression);
            assignmentRange_00.endLoc = in_stack_fffffffffffffeb8;
            assignmentRange_00.startLoc = in_stack_fffffffffffffeb0;
            bVar1 = Bitstream::canBeSource
                              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                               assignmentRange_00,(ASTContext *)in_stack_fffffffffffffe98);
            if (bVar1) {
              local_8 = BumpAllocator::
                        emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                                  (&in_stack_fffffffffffffe70->super_BumpAllocator,
                                   (Type *)in_stack_fffffffffffffe68,
                                   (ConversionKind *)
                                   CONCAT17(in_stack_fffffffffffffe67,
                                            CONCAT16(in_stack_fffffffffffffe66,
                                                     in_stack_fffffffffffffe60)),
                                   (Expression *)in_stack_fffffffffffffe58,
                                   (SourceRange *)
                                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
              selfDetermined((ASTContext *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),in_RSI);
            }
            else {
              local_8 = (ConversionExpression *)
                        badExpr(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
            }
          }
          else if ((in_RDX->super_Expression).kind == ValueRange) {
            this = as<slang::ast::ValueRangeExpression>(&in_RDX->super_Expression);
            pTVar6 = not_null<const_slang::ast::Type_*>::operator*
                               ((not_null<const_slang::ast::Type_*> *)0x9ea468);
            args = (Type *)&this->rangeKind;
            ValueRangeExpression::left(this);
            pEVar5 = convertAssignment::anon_class_40_5_378a8a91::operator()
                               ((anon_class_40_5_378a8a91 *)in_stack_fffffffffffffe58,
                                (Expression *)
                                CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
            ValueRangeExpression::right(this);
            convertAssignment::anon_class_40_5_378a8a91::operator()
                      ((anon_class_40_5_378a8a91 *)in_stack_fffffffffffffe58,
                       (Expression *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
            local_8 = (ConversionExpression *)
                      BumpAllocator::
                      emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                                ((BumpAllocator *)pEVar5,args,(ValueRangeKind *)pTVar6,
                                 (Expression *)args_2,
                                 (Expression *)
                                 CONCAT17(in_stack_fffffffffffffe67,
                                          CONCAT16(in_stack_fffffffffffffe66,
                                                   in_stack_fffffffffffffe60)),
                                 (SourceRange *)in_stack_fffffffffffffe58);
            (local_8->super_Expression).syntax = (in_RDX->super_Expression).syntax;
          }
          else {
            pTVar6 = (Type *)&in_RDI->flags;
            bitmask<slang::ast::ASTFlags>::bitmask(&local_118,OutputArg);
            DVar7 = SUB84((ulong)in_stack_fffffffffffffe70 >> 0x20,0);
            bVar2 = bitmask<slang::ast::ASTFlags>::has
                              ((bitmask<slang::ast::ASTFlags> *)
                               CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                               (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe48);
            bVar1 = false;
            if (!bVar2) {
              bVar2 = Type::isCastCompatible
                                (pTVar6,(Type *)CONCAT17(in_stack_fffffffffffffe57,
                                                         in_stack_fffffffffffffe50));
              in_stack_fffffffffffffe57 = true;
              bVar1 = (bool)in_stack_fffffffffffffe57;
              if (!bVar2) {
                in_stack_fffffffffffffe57 =
                     Type::isBitstreamCastable(pTVar6,(Type *)CONCAT17(1,in_stack_fffffffffffffe50))
                ;
                bVar1 = (bool)in_stack_fffffffffffffe57;
              }
            }
            sourceRange_00.startLoc._6_1_ = in_stack_fffffffffffffe66;
            sourceRange_00.startLoc._0_6_ = in_stack_fffffffffffffe60;
            sourceRange_00.startLoc._7_1_ = bVar1;
            sourceRange_00.endLoc = in_stack_fffffffffffffe68;
            ASTContext::addDiag((ASTContext *)pTVar6,DVar7,sourceRange_00);
            ast::operator<<((Diagnostic *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe88);
            ast::operator<<((Diagnostic *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            in_stack_fffffffffffffe88);
            if (in_R9 != (undefined8 *)0x0) {
              range.endLoc._0_7_ = in_stack_fffffffffffffe50;
              range.startLoc = (SourceLocation)in_stack_fffffffffffffe48;
              range.endLoc._7_1_ = in_stack_fffffffffffffe57;
              Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe40,range);
            }
            range_00.endLoc._0_7_ = in_stack_fffffffffffffe50;
            range_00.startLoc = (SourceLocation)in_stack_fffffffffffffe48;
            range_00.endLoc._7_1_ = in_stack_fffffffffffffe57;
            Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe40,range_00);
            local_8 = (ConversionExpression *)
                      badExpr(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          }
        }
      }
    }
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& Expression::convertAssignment(const ASTContext& context, const Type& type,
                                          Expression& expr, SourceRange assignmentRange,
                                          Expression** lhsExpr, bitmask<AssignFlags>* assignFlags) {
    if (expr.bad())
        return expr;

    Compilation& comp = context.getCompilation();
    if (type.isError())
        return badExpr(comp, &expr);

    Expression* result = &expr;
    const Type* rt = expr.type;

    auto finalizeType = [&](const Type& t) {
        contextDetermined(context, result, nullptr, t, assignmentRange, ConversionKind::Implicit);
    };

    if (type.isEquivalent(*rt)) {
        finalizeType(*rt);

        if (type.isVoid())
            context.addDiag(diag::VoidAssignment, expr.sourceRange);

        // If the types are not actually matching we might still want
        // to issue conversion warnings.
        if (!context.inUnevaluatedBranch() && !type.isMatching(*rt)) {
            ConversionExpression::checkImplicitConversions(context, *rt, type, *result, nullptr,
                                                           assignmentRange,
                                                           ConversionKind::Implicit);
        }

        return *result;
    }

    // If this is a port connection to an array of instances, check if the provided
    // expression represents an array that should be sliced on a per-instance basis.
    auto instance = context.getInstance();
    if (instance && !instance->arrayPath.empty()) {
        // If the connection is already of the right size and simply differs in
        // terms of four-statedness or signedness, don't bother trying to slice
        // out the connection.
        if (type.getBitWidth() != rt->getBitWidth() || !type.isAssignmentCompatible(*rt)) {
            // If we have an lhsExpr here, this is an output (or inout) port being connected.
            // We need to pass the lhs in as the expression to be connected, since we can't
            // slice the port side. If lhsExpr is null, this is an input port and we should
            // slice the incoming expression as an rvalue.
            if (lhsExpr) {
                Expression* conn = tryConnectPortArray(context, *rt, **lhsExpr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    *lhsExpr = conn;

                    SLANG_ASSERT(assignFlags);
                    if (assignFlags)
                        *assignFlags |= AssignFlags::SlicedPort;

                    selfDetermined(context, result);
                    return *result;
                }
            }
            else {
                Expression* conn = tryConnectPortArray(context, type, expr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    return *conn;
                }
            }
        }
    }

    if (!type.isAssignmentCompatible(*rt)) {
        if (expr.isImplicitlyAssignableTo(comp, type)) {
            return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit,
                                                      *result, nullptr, assignmentRange);
        }

        if (expr.kind == ExpressionKind::Streaming) {
            if (Bitstream::canBeSource(type, expr.as<StreamingConcatenationExpression>(),
                                       assignmentRange, context)) {
                // Add an implicit bit-stream casting otherwise types are not assignment compatible.
                // The size rule is not identical to explicit bit-stream casting so a different
                // ConversionKind is used.
                result = comp.emplace<ConversionExpression>(type, ConversionKind::StreamingConcat,
                                                            *result, result->sourceRange);
                selfDetermined(context, result);
                return *result;
            }
            return badExpr(comp, &expr);
        }

        if (expr.kind == ExpressionKind::ValueRange) {
            // Convert each side of the range and return that as a new range.
            auto convert = [&](Expression& expr) -> Expression& {
                if (expr.kind == ExpressionKind::UnboundedLiteral)
                    return expr;
                return convertAssignment(context, type, expr, assignmentRange, lhsExpr,
                                         assignFlags);
            };

            auto& vre = expr.as<ValueRangeExpression>();
            result = comp.emplace<ValueRangeExpression>(*expr.type, vre.rangeKind,
                                                        convert(vre.left()), convert(vre.right()),
                                                        expr.sourceRange);
            result->syntax = expr.syntax;
            return *result;
        }

        DiagCode code = diag::BadAssignment;
        if (!context.flags.has(ASTFlags::OutputArg) &&
            (type.isCastCompatible(*rt) || type.isBitstreamCastable(*rt))) {
            code = diag::NoImplicitConversion;
        }

        auto& diag = context.addDiag(code, assignmentRange);
        diag << *rt << type;
        if (lhsExpr)
            diag << (*lhsExpr)->sourceRange;

        diag << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (type.isNumeric() && rt->isNumeric()) {
        // The "signednessFromRt" flag is important here; only the width of the lhs is
        // propagated down to operands, not the sign flag. Once the expression is appropriately
        // sized, the makeImplicit call down below will convert the sign for us.
        rt = OpInfo::binaryType(comp, &type, rt, false, /* signednessFromRt */ true);

        // If the final type is the same type (or equivalent) of the lhs, we know we're
        // performing an expansion of the rhs. The propagation performed by contextDetermined
        // will ensure that the expression has the correct resulting type, so we don't need an
        // additional implicit conversion. What's not obvious here is that simple assignments like:
        //      logic [3:0] a;
        //      logic [8:0] b;
        //      initial b = a;
        // will still result in an appropriate conversion warning because the type propagation
        // visitor will see that we're in an assignment and insert an implicit conversion for us.
        if (type.isEquivalent(*rt)) {
            finalizeType(type);
            return *result;
        }

        // Otherwise use the common type and fall through to get an implicit conversion
        // created for us.
        finalizeType(*rt);
    }

    return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit, *result,
                                              nullptr, assignmentRange);
}